

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O2

longdouble * __thiscall
mp::QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
          (longdouble *__return_storage_ptr__,QuadAndLinTerms *this,
          vector<double,_std::allocator<double>_> *x)

{
  longdouble *plVar1;
  vector<double,_std::allocator<double>_> *x_00;
  
  LinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,&this->super_LinTerms,x);
  plVar1 = QuadTerms::ComputeValue<std::vector<double,std::allocator<double>>>
                     ((longdouble *)((long)__return_storage_ptr__ + 0x78),(QuadTerms *)this,x_00);
  return plVar1;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    return LinTerms::ComputeValue(x) + QuadTerms::ComputeValue(x);
  }